

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O2

void __thiscall
ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_t::stat_impl<true>
          (data_t *this,uint64_t *count,
          vector<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
          *result,int i)

{
  __pointer_type paVar1;
  ushort uVar2;
  int j;
  long lVar3;
  __int_type_conflict value;
  ushort local_3a;
  __atomic_base<unsigned_long> local_38;
  
  paVar1 = (this->arr)._M_elems[i]._M_b._M_p;
  if (paVar1 != (__pointer_type)0x0) {
    for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
      local_38._M_i = paVar1->_M_elems[lVar3].super___atomic_base<unsigned_long>._M_i;
      if (local_38._M_i != 0) {
        uVar2 = (ushort)(i << 7) | (ushort)lVar3;
        local_3a = 0x1fff - uVar2;
        if (uVar2 < 0x2000) {
          local_3a = uVar2;
        }
        std::vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>::
        emplace_back<unsigned_short,unsigned_long&>
                  ((vector<std::pair<short,unsigned_long>,std::allocator<std::pair<short,unsigned_long>>>
                    *)result,&local_3a,&local_38._M_i);
        *count = *count + local_38._M_i;
      }
    }
  }
  return;
}

Assistant:

void stat_impl(uint64_t& count,
                   std::vector<std::pair<int16_t, uint_type>>& result, int i) {
      auto piece = arr[i].load(std::memory_order_relaxed);
      if (piece) {
        if constexpr (inc_order) {
          for (int j = 0; j < piece->size(); ++j) {
            auto value = (*piece)[j].load(std::memory_order_relaxed);
            if (value) {
              result.emplace_back(get_ordered_index(i * piece_size + j), value);
              count += value;
            }
          }
        }
        else {
          for (int j = piece->size() - 1; j >= 0; --j) {
            auto value = (*piece)[j].load(std::memory_order_relaxed);
            if (value) {
              result.emplace_back(get_ordered_index(i * piece_size + j), value);
              count += value;
            }
          }
        }
      }
    }